

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int ptls_build_certificate_message
              (ptls_buffer_t *buf,ptls_iovec_t context,ptls_iovec_t *certificates,
              size_t num_certificates,ptls_iovec_t ocsp_status)

{
  uint8_t *puVar1;
  size_t sVar2;
  size_t sVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  size_t sVar7;
  long lVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  
  sVar10 = context.len;
  iVar6 = ptls_buffer_reserve(buf,1);
  if (iVar6 == 0) {
    buf->base[buf->off] = '\0';
    sVar11 = buf->off;
    sVar12 = sVar11 + 1;
    buf->off = sVar12;
    cVar4 = (char)sVar12;
    cVar5 = cVar4;
    if (sVar10 != 0) {
      iVar6 = ptls_buffer_reserve(buf,sVar10);
      if (iVar6 != 0) {
        return iVar6;
      }
      memcpy(buf->base + buf->off,context.base,sVar10);
      sVar10 = sVar10 + buf->off;
      buf->off = sVar10;
      cVar5 = (char)sVar10;
    }
    buf->base[sVar11] = cVar5 - cVar4;
    iVar6 = ptls_buffer_reserve(buf,3);
    if (iVar6 == 0) {
      puVar1 = buf->base;
      sVar10 = buf->off;
      puVar1[sVar10 + 2] = '\0';
      puVar1 = puVar1 + sVar10;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      sVar11 = buf->off;
      sVar10 = sVar11 + 3;
      buf->off = sVar10;
      sVar12 = sVar10;
      if (num_certificates != 0) {
        sVar12 = 0;
        do {
          iVar6 = ptls_buffer_reserve(buf,3);
          if (iVar6 != 0) {
            return iVar6;
          }
          puVar1 = buf->base;
          sVar2 = buf->off;
          puVar1[sVar2 + 2] = '\0';
          puVar1 = puVar1 + sVar2;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          sVar13 = buf->off;
          sVar2 = sVar13 + 3;
          buf->off = sVar2;
          sVar7 = certificates[sVar12].len;
          sVar9 = sVar2;
          if (sVar7 != 0) {
            puVar1 = certificates[sVar12].base;
            iVar6 = ptls_buffer_reserve(buf,sVar7);
            if (iVar6 != 0) {
              return iVar6;
            }
            memcpy(buf->base + buf->off,puVar1,sVar7);
            sVar9 = sVar7 + buf->off;
            buf->off = sVar9;
          }
          lVar8 = 0x10;
          do {
            buf->base[sVar13] = (uint8_t)(sVar9 - sVar2 >> ((byte)lVar8 & 0x3f));
            lVar8 = lVar8 + -8;
            sVar13 = sVar13 + 1;
          } while (lVar8 != -8);
          iVar6 = ptls_buffer_reserve(buf,2);
          if (iVar6 != 0) {
            return iVar6;
          }
          puVar1 = buf->base;
          sVar2 = buf->off;
          (puVar1 + sVar2)[0] = '\0';
          (puVar1 + sVar2)[1] = '\0';
          sVar13 = buf->off;
          sVar2 = sVar13 + 2;
          buf->off = sVar2;
          sVar7 = sVar2;
          if (sVar12 == 0 && ocsp_status.len != 0) {
            iVar6 = ptls_buffer_reserve(buf,2);
            if (iVar6 != 0) {
              return iVar6;
            }
            puVar1 = buf->base;
            sVar7 = buf->off;
            (puVar1 + sVar7)[0] = '\0';
            (puVar1 + sVar7)[1] = '\x05';
            buf->off = buf->off + 2;
            iVar6 = ptls_buffer_reserve(buf,2);
            if (iVar6 != 0) {
              return iVar6;
            }
            puVar1 = buf->base;
            sVar7 = buf->off;
            (puVar1 + sVar7)[0] = '\0';
            (puVar1 + sVar7)[1] = '\0';
            sVar7 = buf->off;
            buf->off = sVar7 + 2;
            iVar6 = ptls_buffer_reserve(buf,1);
            if (iVar6 != 0) {
              return iVar6;
            }
            buf->base[buf->off] = '\x01';
            buf->off = buf->off + 1;
            iVar6 = ptls_buffer_reserve(buf,3);
            if (iVar6 != 0) {
              return iVar6;
            }
            puVar1 = buf->base;
            sVar9 = buf->off;
            puVar1[sVar9 + 2] = '\0';
            puVar1 = puVar1 + sVar9;
            puVar1[0] = '\0';
            puVar1[1] = '\0';
            sVar14 = buf->off;
            sVar9 = sVar14 + 3;
            buf->off = sVar9;
            iVar6 = ptls_buffer__do_pushv(buf,ocsp_status.base,ocsp_status.len);
            if (iVar6 != 0) {
              return iVar6;
            }
            sVar3 = buf->off;
            lVar8 = 0x10;
            do {
              buf->base[sVar14] = (uint8_t)(sVar3 - sVar9 >> ((byte)lVar8 & 0x3f));
              lVar8 = lVar8 + -8;
              sVar14 = sVar14 + 1;
            } while (lVar8 != -8);
            lVar8 = buf->off - (sVar7 + 2);
            buf->base[sVar7] = (uint8_t)((ulong)lVar8 >> 8);
            buf->base[sVar7 + 1] = (uint8_t)lVar8;
            sVar7 = buf->off;
          }
          buf->base[sVar13] = (uint8_t)(sVar7 - sVar2 >> 8);
          buf->base[sVar13 + 1] = (uint8_t)(sVar7 - sVar2);
          sVar12 = sVar12 + 1;
        } while (sVar12 != num_certificates);
        sVar12 = buf->off;
      }
      lVar8 = 0x10;
      do {
        buf->base[sVar11] = (uint8_t)(sVar12 - sVar10 >> ((byte)lVar8 & 0x3f));
        lVar8 = lVar8 + -8;
        sVar11 = sVar11 + 1;
      } while (lVar8 != -8);
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

int ptls_build_certificate_message(ptls_buffer_t *buf, ptls_iovec_t context, ptls_iovec_t *certificates, size_t num_certificates,
                                   ptls_iovec_t ocsp_status)
{
    int ret;

    ptls_buffer_push_block(buf, 1, { ptls_buffer_pushv(buf, context.base, context.len); });
    ptls_buffer_push_block(buf, 3, {
        size_t i;
        for (i = 0; i != num_certificates; ++i) {
            ptls_buffer_push_block(buf, 3, { ptls_buffer_pushv(buf, certificates[i].base, certificates[i].len); });
            ptls_buffer_push_block(buf, 2, {
                if (i == 0 && ocsp_status.len != 0) {
                    buffer_push_extension(buf, PTLS_EXTENSION_TYPE_STATUS_REQUEST, {
                        ptls_buffer_push(buf, 1); /* status_type == ocsp */
                        ptls_buffer_push_block(buf, 3, { ptls_buffer_pushv(buf, ocsp_status.base, ocsp_status.len); });
                    });
                }
            });
        }
    });

    ret = 0;
Exit:
    return ret;
}